

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O1

bool dxil_spv::analyze_load_instruction(Impl *impl,LoadInst *inst)

{
  undefined4 uVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  GlobalVariable *pGVar4;
  bool bVar5;
  ValueKind VVar6;
  uint uVar7;
  Value *pVVar8;
  ConstantExpr *pCVar9;
  Type *this;
  ConstantExpr *this_00;
  Constant *pCVar10;
  mapped_type *pmVar11;
  LoggingCallback p_Var12;
  void *pvVar13;
  __hash_code __code;
  ulong uVar14;
  __node_base_ptr p_Var15;
  __node_base_ptr p_Var16;
  _Hash_node_base *p_Var17;
  AllocaTrackedIndex tracked;
  char buffer [4096];
  undefined1 local_106d;
  undefined3 uStack_106c;
  AllocaTrackedIndex local_1058;
  ConstantExpr *local_1038;
  undefined5 uStack_1030;
  undefined3 uStack_102b;
  undefined5 local_1028;
  undefined3 uStack_1023;
  undefined5 uStack_1020;
  undefined3 uStack_101b;
  char local_1018 [4072];
  
  pVVar8 = LLVMBC::LoadInst::getPointerOperand(inst);
  gep_pointer_to_alloca_tracked_inst(&local_1058,impl,pVVar8);
  if (local_1058.cbv_handle != (Value *)0x0) {
    *(undefined1 *)
     ((long)local_1058.itr.
            super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
            ._M_cur + 0x28) = 1;
    pVVar8 = LLVMBC::LoadInst::getPointerOperand(inst);
    pCVar9 = (ConstantExpr *)LLVMBC::Internal::resolve_proxy(pVVar8);
    VVar6 = LLVMBC::Value::get_value_kind((Value *)pCVar9);
    if (VVar6 != GetElementPtr) {
      p_Var12 = get_thread_log_callback();
      if (p_Var12 != (LoggingCallback)0x0) {
        local_1028 = 0x6163206e69;
        uStack_1023 = 0x3c7473;
        uStack_1020 = 0xa2e3e54;
        local_1038 = (ConstantExpr *)0x2064696c61766e49;
        uStack_1030 = 0x2065707974;
        uStack_102b = 0x204449;
        pvVar13 = get_thread_log_callback_userdata();
        (*p_Var12)(pvVar13,Error,(char *)&local_1038);
        std::terminate();
      }
      analyze_load_instruction();
      std::terminate();
    }
    local_1038 = pCVar9;
    std::
    _Hashtable<const_LLVMBC::GetElementPtrInst_*,_const_LLVMBC::GetElementPtrInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::GetElementPtrInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::GetElementPtrInst_*>,_std::hash<const_LLVMBC::GetElementPtrInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(impl->masked_alloca_forward_gep)._M_h);
  }
  pVVar8 = LLVMBC::LoadInst::getPointerOperand(inst);
  this = LLVMBC::Value::getType(pVVar8);
  uVar7 = LLVMBC::Type::getPointerAddressSpace(this);
  if ((char)uVar7 == '\x03') {
    (impl->shader_analysis).has_group_shared_access = true;
  }
  pVVar8 = LLVMBC::LoadInst::getPointerOperand(inst);
  if (pVVar8 == (Value *)0x0) {
    pCVar9 = (ConstantExpr *)0x0;
  }
  else {
    this_00 = (ConstantExpr *)LLVMBC::Internal::resolve_proxy(pVVar8);
    VVar6 = LLVMBC::Value::get_value_kind((Value *)this_00);
    pCVar9 = (ConstantExpr *)0x0;
    if (VVar6 == ConstantExpr) {
      pCVar9 = this_00;
    }
  }
  bVar5 = true;
  if ((pCVar9 == (ConstantExpr *)0x0) ||
     (uVar7 = LLVMBC::ConstantExpr::getOpcode(pCVar9), uVar7 != 200)) goto LAB_00158e22;
  pCVar10 = LLVMBC::ConstantExpr::getOperand(pCVar9,0);
  uVar2 = (impl->llvm_global_variable_to_resource_mapping)._M_h._M_bucket_count;
  uVar14 = (ulong)pCVar10 % uVar2;
  p_Var15 = (impl->llvm_global_variable_to_resource_mapping)._M_h._M_buckets[uVar14];
  p_Var16 = (__node_base_ptr)0x0;
  if ((p_Var15 != (__node_base_ptr)0x0) &&
     (p_Var17 = p_Var15->_M_nxt, p_Var16 = p_Var15, pCVar10 != (Constant *)p_Var15->_M_nxt[1]._M_nxt
     )) {
    while (p_Var15 = p_Var17, p_Var17 = p_Var15->_M_nxt, p_Var17 != (_Hash_node_base *)0x0) {
      p_Var16 = (__node_base_ptr)0x0;
      if (((ulong)p_Var17[1]._M_nxt % uVar2 != uVar14) ||
         (p_Var16 = p_Var15, pCVar10 == (Constant *)p_Var17[1]._M_nxt)) goto LAB_00158ce5;
    }
    p_Var16 = (__node_base_ptr)0x0;
  }
LAB_00158ce5:
  if (p_Var16 == (__node_base_ptr)0x0) {
    p_Var17 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var17 = p_Var16->_M_nxt;
  }
  if (p_Var17 == (_Hash_node_base *)0x0) goto LAB_00158e22;
  pCVar10 = LLVMBC::ConstantExpr::getOperand(pCVar9,1);
  pVVar8 = LLVMBC::Internal::resolve_proxy(&pCVar10->super_Value);
  VVar6 = LLVMBC::Value::get_value_kind(pVVar8);
  if (VVar6 == ConstantInt) {
    uVar7 = LLVMBC::ConstantExpr::getNumOperands(pCVar9);
    if (uVar7 == 3) {
      p_Var3 = p_Var17[2]._M_nxt;
      pGVar4 = (GlobalVariable *)p_Var17[4]._M_nxt;
      uStack_106c = (undefined3)((uint)*(undefined4 *)((long)&p_Var17[5]._M_nxt + 4) >> 8);
      uVar1 = *(undefined4 *)((long)&p_Var17[5]._M_nxt + 1);
      pCVar10 = LLVMBC::ConstantExpr::getOperand(pCVar9,2);
      local_1038 = pCVar9;
      pmVar11 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_global_variable_to_resource_mapping,
                             (key_type *)&local_1038);
      *(_Hash_node_base **)pmVar11 = p_Var3;
      pmVar11->offset = &pCVar10->super_Value;
      pmVar11->variable = pGVar4;
      pmVar11->non_uniform = false;
      local_106d = (undefined1)((uint)uVar1 >> 0x18);
      *(undefined4 *)&pmVar11->field_0x19 = uVar1;
      *(uint *)&pmVar11->field_0x1c = CONCAT31(uStack_106c,local_106d);
      goto LAB_00158e22;
    }
    p_Var12 = get_thread_log_callback();
    if (p_Var12 != (LoggingCallback)0x0) {
      memcpy(&local_1038,
             "Number of operands to getelementptr for a resource handle is unexpected.\n",0x4a);
      goto LAB_00158e0d;
    }
    analyze_load_instruction();
  }
  else {
    p_Var12 = get_thread_log_callback();
    if (p_Var12 == (LoggingCallback)0x0) {
      analyze_load_instruction();
    }
    else {
      builtin_strncpy(local_1018,"ot constant 0.\n",0x10);
      local_1028 = 0x6f20727450;
      uStack_1023 = 0x726570;
      uStack_1020 = 0x6920646e61;
      uStack_101b = 0x6e2073;
      local_1038 = (ConstantExpr *)0x6547207473726946;
      uStack_1030 = 0x6d656c4574;
      uStack_102b = 0x746e65;
LAB_00158e0d:
      pvVar13 = get_thread_log_callback_userdata();
      (*p_Var12)(pvVar13,Error,(char *)&local_1038);
    }
  }
  bVar5 = false;
LAB_00158e22:
  if (bVar5) {
    pVVar8 = LLVMBC::LoadInst::getPointerOperand(inst);
    uVar2 = (impl->llvm_global_variable_to_resource_mapping)._M_h._M_bucket_count;
    uVar14 = (ulong)pVVar8 % uVar2;
    p_Var15 = (impl->llvm_global_variable_to_resource_mapping)._M_h._M_buckets[uVar14];
    p_Var16 = (__node_base_ptr)0x0;
    if ((p_Var15 != (__node_base_ptr)0x0) &&
       (p_Var17 = p_Var15->_M_nxt, p_Var16 = p_Var15, pVVar8 != (Value *)p_Var15->_M_nxt[1]._M_nxt))
    {
      while (p_Var15 = p_Var17, p_Var17 = p_Var15->_M_nxt, p_Var17 != (_Hash_node_base *)0x0) {
        p_Var16 = (__node_base_ptr)0x0;
        if (((ulong)p_Var17[1]._M_nxt % uVar2 != uVar14) ||
           (p_Var16 = p_Var15, pVVar8 == (Value *)p_Var17[1]._M_nxt)) goto LAB_00158e93;
      }
      p_Var16 = (__node_base_ptr)0x0;
    }
LAB_00158e93:
    if (p_Var16 == (__node_base_ptr)0x0) {
      p_Var17 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var17 = p_Var16->_M_nxt;
    }
    if (p_Var17 != (_Hash_node_base *)0x0) {
      local_1038 = (ConstantExpr *)inst;
      pmVar11 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_global_variable_to_resource_mapping,
                             (key_type *)&local_1038);
      pVVar8 = (Value *)p_Var17[3]._M_nxt;
      pGVar4 = (GlobalVariable *)p_Var17[4]._M_nxt;
      p_Var3 = p_Var17[5]._M_nxt;
      *(_Hash_node_base **)pmVar11 = p_Var17[2]._M_nxt;
      pmVar11->offset = pVVar8;
      pmVar11->variable = pGVar4;
      *(_Hash_node_base **)&pmVar11->non_uniform = p_Var3;
    }
  }
  return bVar5;
}

Assistant:

bool analyze_load_instruction(Converter::Impl &impl, const llvm::LoadInst *inst)
{
	auto tracked = gep_pointer_to_alloca_tracked_inst(impl, inst->getPointerOperand());
	if (tracked.cbv_handle)
	{
		tracked.itr->second.has_load = true;
		// We'll need this GEP after all.
		impl.masked_alloca_forward_gep.erase(llvm::cast<llvm::GetElementPtrInst>(inst->getPointerOperand()));
	}

	if (DXIL::AddressSpace(inst->getPointerOperand()->getType()->getPointerAddressSpace()) == DXIL::AddressSpace::GroupShared)
		impl.shader_analysis.has_group_shared_access = true;

	if (auto *const_expr = llvm::dyn_cast<llvm::ConstantExpr>(inst->getPointerOperand()))
	{
		if (const_expr->getOpcode() == llvm::Instruction::GetElementPtr)
		{
			auto *ptr = const_expr->getOperand(0);
			auto itr = impl.llvm_global_variable_to_resource_mapping.find(ptr);
			if (itr != impl.llvm_global_variable_to_resource_mapping.end() &&
			    !emit_getelementptr_resource(impl, const_expr, itr->second))
			{
				return false;
			}
		}
	}

	auto itr = impl.llvm_global_variable_to_resource_mapping.find(inst->getPointerOperand());
	if (itr != impl.llvm_global_variable_to_resource_mapping.end())
		impl.llvm_global_variable_to_resource_mapping[inst] = itr->second;

	return true;
}